

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintMask(UNITY_UINT mask,UNITY_UINT number)

{
  int iVar1;
  int __c;
  ulong uVar2;
  
  uVar2 = 0x80000000;
  iVar1 = 0x20;
  do {
    __c = 0x31 - (uint)((uVar2 & number) == 0);
    if ((uVar2 & mask) == 0) {
      __c = 0x58;
    }
    putchar(__c);
    uVar2 = uVar2 >> 1;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void UnityPrintMask(const UNITY_UINT mask, const UNITY_UINT number)
{
    UNITY_UINT current_bit = (UNITY_UINT)1 << (UNITY_INT_WIDTH - 1);
    UNITY_INT32 i;

    for (i = 0; i < UNITY_INT_WIDTH; i++)
    {
        if (current_bit & mask)
        {
            if (current_bit & number)
            {
                UNITY_OUTPUT_CHAR('1');
            }
            else
            {
                UNITY_OUTPUT_CHAR('0');
            }
        }
        else
        {
            UNITY_OUTPUT_CHAR('X');
        }
        current_bit = current_bit >> 1;
    }
}